

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::clear(Net *this)

{
  bool bVar4;
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  undefined3 uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  Option opt1;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear(&this->blobs);
  uVar7 = 0;
  while( true ) {
    ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppLVar2 - (long)ppLVar1 >> 3) <= uVar7) break;
    pLVar3 = ppLVar1[uVar7];
    opt1.use_int8_arithmetic = (this->opt).use_int8_arithmetic;
    opt1.use_packing_layout = (this->opt).use_packing_layout;
    opt1.use_shader_pack8 = (this->opt).use_shader_pack8;
    opt1.use_image_storage = (this->opt).use_image_storage;
    bVar4 = (this->opt).use_bf16_storage;
    uVar5 = *(undefined3 *)&(this->opt).field_0x25;
    opt1._36_4_ = CONCAT31(uVar5,bVar4);
    opt1.lightmode = (this->opt).lightmode;
    opt1._1_3_ = *(undefined3 *)&(this->opt).field_0x1;
    opt1.num_threads = (this->opt).num_threads;
    opt1.blob_allocator._0_4_ = *(undefined4 *)&(this->opt).blob_allocator;
    opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
    opt1.workspace_allocator._0_4_ = *(undefined4 *)&(this->opt).workspace_allocator;
    opt1.workspace_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
    opt1.use_winograd_convolution = (this->opt).use_winograd_convolution;
    opt1.use_sgemm_convolution = (this->opt).use_sgemm_convolution;
    opt1.use_int8_inference = (this->opt).use_int8_inference;
    opt1.use_vulkan_compute = (this->opt).use_vulkan_compute;
    opt1.use_fp16_packed = (this->opt).use_fp16_packed;
    opt1.use_fp16_storage = (this->opt).use_fp16_storage;
    opt1.use_fp16_arithmetic = (this->opt).use_fp16_arithmetic;
    opt1.use_int8_storage = (this->opt).use_int8_storage;
    if (pLVar3->support_image_storage == false) {
      opt1.use_image_storage = false;
    }
    iVar6 = (*pLVar3->_vptr_Layer[5])(pLVar3,&opt1);
    if (iVar6 != 0) {
      fwrite("layer destroy_pipeline failed",0x1d,1,_stderr);
      fputc(10,_stderr);
    }
    (*pLVar3->_vptr_Layer[1])(pLVar3);
    uVar7 = uVar7 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  return;
}

Assistant:

void Net::clear()
{
#if NCNN_VULKAN
    destroy_pipeline();
#endif // NCNN_VULKAN

    blobs.clear();
    for (size_t i=0; i<layers.size(); i++)
    {
        Layer* layer = layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        delete layer;
    }
    layers.clear();

#if NCNN_VULKAN
    if (weight_vkallocator)
    {
        delete weight_vkallocator;
        weight_vkallocator = 0;
    }
    if (weight_staging_vkallocator)
    {
        delete weight_staging_vkallocator;
        weight_staging_vkallocator = 0;
    }
#endif // NCNN_VULKAN
}